

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTDMT_bufferPool * ZSTDMT_createBufferPool(uint maxNbBuffers,ZSTD_customMem cMem)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  size_t __size;
  
  __size = (ulong)(maxNbBuffers - 1) * 0x10 + 0x60;
  if (cMem.customAlloc == (ZSTD_allocFunction)0x0) {
    __mutex = (pthread_mutex_t *)calloc(1,__size);
  }
  else {
    __mutex = (pthread_mutex_t *)(*cMem.customAlloc)(cMem.opaque,__size);
    memset(__mutex,0,__size);
  }
  if (__mutex != (pthread_mutex_t *)0x0) {
    iVar1 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      __mutex[1].__align = 0x10000;
      *(uint *)((long)__mutex + 0x30) = maxNbBuffers;
      *(undefined4 *)((long)__mutex + 0x34) = 0;
      *(ZSTD_allocFunction *)((long)__mutex + 0x38) = cMem.customAlloc;
      *(ZSTD_freeFunction *)((long)__mutex + 0x40) = cMem.customFree;
      *(void **)((long)__mutex + 0x48) = cMem.opaque;
      return (ZSTDMT_bufferPool *)__mutex;
    }
    if (cMem.customFree == (ZSTD_freeFunction)0x0) {
      free(__mutex);
    }
    else {
      (*cMem.customFree)(cMem.opaque,__mutex);
    }
  }
  return (ZSTDMT_bufferPool *)0x0;
}

Assistant:

static ZSTDMT_bufferPool* ZSTDMT_createBufferPool(unsigned maxNbBuffers, ZSTD_customMem cMem)
{
    ZSTDMT_bufferPool* const bufPool = (ZSTDMT_bufferPool*)ZSTD_customCalloc(
        sizeof(ZSTDMT_bufferPool) + (maxNbBuffers-1) * sizeof(buffer_t), cMem);
    if (bufPool==NULL) return NULL;
    if (ZSTD_pthread_mutex_init(&bufPool->poolMutex, NULL)) {
        ZSTD_customFree(bufPool, cMem);
        return NULL;
    }
    bufPool->bufferSize = 64 KB;
    bufPool->totalBuffers = maxNbBuffers;
    bufPool->nbBuffers = 0;
    bufPool->cMem = cMem;
    return bufPool;
}